

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void rollback_forward_seqnum(void)

{
  fdb_doc *doc;
  fdb_kvs_handle *handle;
  fdb_seqnum_t fVar1;
  fdb_status fVar2;
  size_t sVar3;
  long lVar4;
  char *__format;
  ulong uVar5;
  fdb_kvs_handle *kv1;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  fdb_iterator *it;
  fdb_kvs_handle *mirror_kv1;
  char setop [3];
  fdb_kvs_info info;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_doc *apfStack_558 [101];
  fdb_config fconfig;
  char keybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  rdoc = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig.wal_threshold = 100;
  fconfig.seqtree_opt = '\x01';
  fconfig.flags = 1;
  fconfig.compaction_threshold = '\0';
  fconfig.purging_interval = 5;
  fconfig.block_reusing_threshold = 0;
  fdb_open(&dbfile,"./mvcc_test1",&fconfig);
  fdb_kvs_open(dbfile,&kv1,"kv1",&kvs_config);
  fdb_kvs_open(dbfile,&mirror_kv1,(char *)0x0,&kvs_config);
  lVar4 = 0;
  for (uVar5 = 0; uVar5 != 0x65; uVar5 = uVar5 + 1) {
    sprintf(keybuf,"key%d",uVar5 & 0xffffffff);
    sVar3 = strlen(keybuf);
    fdb_doc_create((fdb_doc **)((long)apfStack_558 + lVar4),keybuf,sVar3,(void *)0x0,0,(void *)0x0,0
                  );
    fdb_set(kv1,apfStack_558[uVar5]);
    handle = mirror_kv1;
    sVar3 = strlen(keybuf);
    fdb_set_kv(handle,keybuf,sVar3,setop,3);
    lVar4 = lVar4 + 8;
  }
  fdb_del(kv1,apfStack_558[100]);
  fdb_commit(dbfile,'\x01');
  fdb_get_kvs_info(kv1,&info);
  fVar1 = info.last_seqnum;
  for (lVar4 = 0; lVar4 != 100; lVar4 = lVar4 + 1) {
    fdb_del(kv1,apfStack_558[lVar4]);
  }
  fdb_commit(dbfile,'\0');
  fdb_get_kvs_info(kv1,&info);
  for (lVar4 = 0; lVar4 != 100; lVar4 = lVar4 + 1) {
    doc = apfStack_558[lVar4];
    doc->deleted = false;
    fdb_set(kv1,doc);
  }
  fdb_commit(dbfile,'\0');
  fVar2 = fdb_rollback(&kv1,(long)(int)fVar1);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xa51);
    rollback_forward_seqnum()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xa51,"void rollback_forward_seqnum()");
  }
  fdb_get_kvs_info(kv1,&info);
  if (info.deleted_count != 1) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
           );
    rollback_forward_seqnum()::__test_pass = '\x01';
    if (info.deleted_count != 1) {
      __assert_fail("info.deleted_count == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xa54,"void rollback_forward_seqnum()");
    }
  }
  fVar2 = fdb_rollback(&kv1,(long)(int)info.last_seqnum);
  if (fVar2 == FDB_RESULT_NO_DB_INSTANCE) {
    fVar2 = fdb_iterator_sequence_init(mirror_kv1,&it,0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xa5b);
      rollback_forward_seqnum()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xa5b,"void rollback_forward_seqnum()");
    }
    do {
      fVar2 = fdb_iterator_get(it,&rdoc);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xa5f);
        rollback_forward_seqnum()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xa5f,"void rollback_forward_seqnum()");
      }
      if (rdoc->seqnum == 0x65) {
        fVar2 = fdb_get_metaonly(kv1,rdoc);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xa66);
          rollback_forward_seqnum()::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xa66,"void rollback_forward_seqnum()");
        }
        if (rdoc->deleted == false) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xa67);
          rollback_forward_seqnum()::__test_pass = '\x01';
          if (rdoc->deleted == false) {
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xa67,"void rollback_forward_seqnum()");
          }
        }
      }
      else {
        fVar2 = fdb_get_metaonly_byseq(kv1,rdoc);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xa62);
          rollback_forward_seqnum()::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xa62,"void rollback_forward_seqnum()");
        }
        if (rdoc->deleted != false) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xa63);
          rollback_forward_seqnum()::__test_pass = '\x01';
          if (rdoc->deleted != false) {
            __assert_fail("rdoc->deleted == false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xa63,"void rollback_forward_seqnum()");
          }
        }
      }
      fdb_doc_free(rdoc);
      rdoc = (fdb_doc *)0x0;
      fVar2 = fdb_iterator_next(it);
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    for (lVar4 = 0; lVar4 != 0x65; lVar4 = lVar4 + 1) {
      fdb_doc_free(apfStack_558[lVar4]);
    }
    fdb_iterator_close(it);
    fdb_kvs_close(kv1);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();
    __format = "%s PASSED\n";
    if (rollback_forward_seqnum()::__test_pass != '\0') {
      __format = "%s FAILED\n";
    }
    fprintf(_stderr,__format,"rollback forward seqnum");
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0xa58);
  rollback_forward_seqnum()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_NO_DB_INSTANCE",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xa58,"void rollback_forward_seqnum()");
}

Assistant:

void rollback_forward_seqnum()
{

    TEST_INIT();
    memleak_start();

    int r;
    int i, n=100;
    int rb1_seqnum, rb2_seqnum;
    char keybuf[256];
    char setop[3];
    fdb_file_handle *dbfile;
    fdb_iterator *it;
    fdb_kvs_handle *kv1, *mirror_kv1;
    fdb_kvs_info info;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_doc **doc = alca(fdb_doc*, n+1);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fconfig.wal_threshold = n;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.purging_interval = 5;
    fconfig.block_reusing_threshold = 0;

    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    fdb_kvs_open(dbfile, &mirror_kv1, NULL, &kvs_config);


    // set n docs within both dbs
    for(i=0;i<=n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            NULL, 0, NULL, 0);
        fdb_set(kv1, doc[i]);
        fdb_set_kv(mirror_kv1, keybuf, strlen(keybuf), setop, 3);
    } // last set should have caused a wal flush

    fdb_del(kv1, doc[n]);

    // commit and save seqnum1
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    fdb_get_kvs_info(kv1, &info);
    rb1_seqnum = info.last_seqnum;

    // delete all docs in kv1
    for(i=0;i<n;++i){
        fdb_del(kv1, doc[i]);
    }

    // commit and save seqnum2
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    fdb_get_kvs_info(kv1, &info);
    rb2_seqnum = info.last_seqnum;

    // sets again
    for(i=0;i<n;++i){
        doc[i]->deleted = false;
        fdb_set(kv1, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // rollback to first seqnum
    status = fdb_rollback(&kv1, rb1_seqnum);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_get_kvs_info(kv1, &info);
    TEST_CHK(info.deleted_count == 1);

    // rollback to second seqnum
    status = fdb_rollback(&kv1, rb2_seqnum);
    TEST_CHK(status == FDB_RESULT_NO_DB_INSTANCE);

    status = fdb_iterator_sequence_init(mirror_kv1, &it, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    do {
        status = fdb_iterator_get(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (rdoc->seqnum != (uint64_t)n+1) {
            status = fdb_get_metaonly_byseq(kv1, rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CHK(rdoc->deleted == false);
        } else {
            status = fdb_get_metaonly(kv1, rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CHK(rdoc->deleted == true);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while(fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);

    for (i=0;i<=n;++i){
        fdb_doc_free(doc[i]);
    }
    fdb_iterator_close(it);
    fdb_kvs_close(kv1);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();

    TEST_RESULT("rollback forward seqnum");
}